

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O3

void __thiscall qclab::qgates::CX<float>::CX(CX<float> *this)

{
  PauliX<float> *pPVar1;
  
  (this->super_QControlledGate2<float>).control_ = 0;
  (this->super_QControlledGate2<float>).controlState_ = 1;
  (this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004ed4e0;
  pPVar1 = (PauliX<float> *)operator_new(0x10);
  (pPVar1->super_QGate1<float>).qubit_ = 1;
  (pPVar1->super_QGate1<float>).super_QObject<float> = (QObject<float>)&PTR_nbQubits_004e9f00;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliX<float>,_std::default_delete<qclab::qgates::PauliX<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliX<float>_*,_std::default_delete<qclab::qgates::PauliX<float>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliX<float>_*,_false>._M_head_impl = pPVar1;
  return;
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }